

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

void __thiscall
wasm::InsertOrderedSet<wasm::GlobalGet_*>::erase
          (InsertOrderedSet<wasm::GlobalGet_*> *this,GlobalGet **val)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator local_30;
  _Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
  local_20;
  iterator it;
  GlobalGet **val_local;
  InsertOrderedSet<wasm::GlobalGet_*> *this_local;
  
  it.
  super__Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false>
               )val;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::GlobalGet_*,_std::_List_iterator<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::equal_to<wasm::GlobalGet_*>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>_>
       ::find(&this->Map,val);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::GlobalGet_*,_std::_List_iterator<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::equal_to<wasm::GlobalGet_*>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>_>
       ::end(&this->Map);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_false,_false>
                           *)&local_20);
    std::_List_const_iterator<wasm::GlobalGet_*>::_List_const_iterator(&local_30,&ppVar2->second);
    std::__cxx11::list<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>::erase
              (&this->List,local_30);
    std::
    unordered_map<wasm::GlobalGet_*,_std::_List_iterator<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::equal_to<wasm::GlobalGet_*>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>_>
    ::erase(&this->Map,(iterator)local_20._M_cur);
  }
  return;
}

Assistant:

void erase(const T& val) {
    auto it = Map.find(val);
    if (it != Map.end()) {
      List.erase(it->second);
      Map.erase(it);
    }
  }